

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

Schema __thiscall capnp::Schema::getDependency(Schema *this,uint64_t id,uint location)

{
  RawBrandedSchema *this_00;
  RawSchema *this_01;
  Dependency *pDVar1;
  uint32_t uVar2;
  CappedArray<char,_17UL> local_88;
  Fault local_68;
  Fault f;
  uint64_t candidateId;
  RawSchema *candidate_1;
  uint local_48;
  uint mid_1;
  uint upper_1;
  uint lower_1;
  Dependency candidate;
  uint mid;
  uint upper;
  uint lower;
  uint location_local;
  uint64_t id_local;
  Schema *this_local;
  
  mid = 0;
  uVar2 = this->raw->dependencyCount;
  while (candidate.schema._4_4_ = uVar2, mid < candidate.schema._4_4_) {
    uVar2 = mid + candidate.schema._4_4_ >> 1;
    pDVar1 = this->raw->dependencies + uVar2;
    this_00 = pDVar1->schema;
    upper_1 = (uint)*(undefined8 *)pDVar1;
    if (upper_1 == location) {
      _::RawBrandedSchema::ensureInitialized(this_00);
      Schema((Schema *)&this_local,this_00);
      return (Schema)(RawBrandedSchema *)this_local;
    }
    if (upper_1 < location) {
      mid = uVar2 + 1;
      uVar2 = candidate.schema._4_4_;
    }
  }
  mid_1 = 0;
  uVar2 = this->raw->generic->dependencyCount;
  while( true ) {
    local_48 = uVar2;
    if (local_48 <= mid_1) {
      kj::hex(&local_88,id);
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44],kj::CappedArray<char,17ul>>
                (&local_68,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
                 ,0xf5,FAILED,(char *)0x0,
                 "\"Requested ID not found in dependency table.\", kj::hex(id)",
                 (char (*) [44])"Requested ID not found in dependency table.",&local_88);
      Schema((Schema *)&this_local);
      kj::_::Debug::Fault::~Fault(&local_68);
      return (Schema)(RawBrandedSchema *)this_local;
    }
    uVar2 = mid_1 + local_48 >> 1;
    this_01 = this->raw->generic->dependencies[uVar2];
    f.exception = (Exception *)this_01->id;
    if (f.exception == (Exception *)id) break;
    if (f.exception < id) {
      mid_1 = uVar2 + 1;
      uVar2 = local_48;
    }
  }
  _::RawSchema::ensureInitialized(this_01);
  Schema((Schema *)&this_local,&this_01->defaultBrand);
  return (Schema)(RawBrandedSchema *)this_local;
}

Assistant:

Schema Schema::getDependency(uint64_t id, uint location) const {
  {
    // Binary search dependency list.
    uint lower = 0;
    uint upper = raw->dependencyCount;

    while (lower < upper) {
      uint mid = (lower + upper) / 2;

      auto candidate = raw->dependencies[mid];
      if (candidate.location == location) {
        candidate.schema->ensureInitialized();
        return Schema(candidate.schema);
      } else if (candidate.location < location) {
        lower = mid + 1;
      } else {
        upper = mid;
      }
    }
  }

  {
    uint lower = 0;
    uint upper = raw->generic->dependencyCount;

    while (lower < upper) {
      uint mid = (lower + upper) / 2;

      const _::RawSchema* candidate = raw->generic->dependencies[mid];

      uint64_t candidateId = candidate->id;
      if (candidateId == id) {
        candidate->ensureInitialized();
        return Schema(&candidate->defaultBrand);
      } else if (candidateId < id) {
        lower = mid + 1;
      } else {
        upper = mid;
      }
    }
  }

  KJ_FAIL_REQUIRE("Requested ID not found in dependency table.", kj::hex(id)) {
    return Schema();
  }
}